

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void gai_ComputePatchIndexWithSkip
               (Integer ndim,Integer *lo,Integer *plo,Integer *skip,Integer *ld,Integer *idx_buf)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (*plo - *lo) / *skip;
  *idx_buf = lVar5;
  if (1 < ndim) {
    lVar6 = 0;
    do {
      lVar2 = lVar6 + 1;
      lVar3 = lVar6 + 1;
      lVar4 = lVar6 + 1;
      plVar1 = ld + lVar6;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + ((plo[lVar2] - lo[lVar3]) / skip[lVar4]) * *plVar1;
      *idx_buf = lVar5;
    } while (ndim + -1 != lVar6);
  }
  return;
}

Assistant:

void gai_ComputePatchIndexWithSkip(Integer ndim, Integer *lo, Integer *plo,
                                   Integer *skip, Integer *ld, Integer *idx_buf)
{
  Integer i, delta, inc, factor;
  delta = plo[0] - lo[0];
  inc = delta%skip[0];
  delta -= inc;
  delta /=  skip[0];
  *idx_buf = delta;
  for (i=0; i<ndim-1; i++) {
    factor = ld[i];
    delta = plo[i+1]-lo[i+1];
    inc = delta%skip[i+1];
    delta -= inc;
    delta /=  skip[i+1];
    *idx_buf += factor*delta;
  }
}